

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NtpReply.h
# Opt level: O2

qint64 __thiscall NtpReply::roundTripDelay(NtpReply *this)

{
  long lVar1;
  long lVar2;
  NtpTimestamp NStack_38;
  NtpTimestamp local_30;
  QDateTime local_28 [8];
  NtpTimestamp local_20;
  
  NtpTimestamp::toDateTime(&local_20,&(this->m_packet).basic.originateTimestamp);
  QDateTime::QDateTime(local_28,&this->m_destinationTime);
  lVar1 = QDateTime::msecsTo((QDateTime *)&local_20);
  NtpTimestamp::toDateTime(&local_30,&(this->m_packet).basic.receiveTimestamp);
  NtpTimestamp::toDateTime(&NStack_38,&(this->m_packet).basic.transmitTimestamp);
  lVar2 = QDateTime::msecsTo((QDateTime *)&local_30);
  QDateTime::~QDateTime((QDateTime *)&NStack_38);
  QDateTime::~QDateTime((QDateTime *)&local_30);
  QDateTime::~QDateTime(local_28);
  QDateTime::~QDateTime((QDateTime *)&local_20);
  return lVar1 - lVar2;
}

Assistant:

qint64 roundTripDelay() const {
        return originTime().msecsTo(destinationTime()) - receiveTime().msecsTo(transmitTime());
    }